

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O2

int wally_base58_from_bytes(uchar *bytes,size_t bytes_len,uint32_t flags,char **output)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  uchar *dest;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  byte *pbVar7;
  long lVar8;
  ulong __n;
  uchar *puVar9;
  uchar *puVar10;
  byte *pbVar11;
  ulong uVar12;
  int iVar13;
  ulong __n_00;
  long lVar14;
  byte *pbVar15;
  uint32_t *local_258;
  uint32_t checksum;
  uchar bn_buf [512];
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  puVar9 = (uchar *)0x0;
  iVar13 = -2;
  dest = bn_buf;
  if ((((bytes != (uchar *)0x0) && (bytes_len != 0)) && (flags < 2)) && (output != (char **)0x0)) {
    if (flags == 0) {
      local_258 = (uint32_t *)0x0;
      __n = bytes_len;
    }
    else {
      checksum = base58_get_checksum(bytes,bytes_len);
      local_258 = &checksum;
      __n = bytes_len + 4;
    }
    uVar12 = __n * 0x8a;
    lVar8 = 3;
    __n_00 = 0;
    while( true ) {
      if (__n == __n_00) goto LAB_003ef91c;
      puVar9 = (uchar *)((long)local_258 - bytes_len);
      if (__n_00 < bytes_len) {
        puVar9 = bytes;
      }
      if (puVar9[__n_00] != '\0') break;
      __n_00 = __n_00 + 1;
      uVar12 = uVar12 - 0x8a;
      lVar8 = lVar8 + 1;
    }
    if (__n == __n_00) goto LAB_003ef91c;
    uVar3 = uVar12 / 100;
    if (uVar12 < 0xc800) {
      dest = bn_buf;
    }
    else {
      dest = (uchar *)wally_malloc(uVar3 + 1);
      if (dest == (uchar *)0x0) {
        return -3;
      }
    }
    lVar14 = __n_00 + 2;
    pbVar7 = dest + uVar3;
    dest[uVar3] = '\0';
    pbVar15 = pbVar7;
    for (uVar3 = __n_00; uVar3 < __n; uVar3 = uVar3 + 1) {
      pbVar11 = (byte *)((long)local_258 + (uVar3 - bytes_len));
      if (uVar3 < bytes_len) {
        pbVar11 = bytes + uVar3;
      }
      uVar4 = (ulong)*pbVar11;
      for (pbVar11 = pbVar7; pbVar15 <= pbVar11; pbVar11 = pbVar11 + -1) {
        uVar6 = (uint)*pbVar11 * 0x100 + (int)uVar4;
        uVar4 = (ulong)uVar6 / 0x3a;
        *pbVar11 = (byte)((ulong)uVar6 % 0x3a);
        if ((pbVar11 == pbVar15) && (0x39 < uVar6)) {
          pbVar15[-1] = 0;
          pbVar15 = pbVar15 + -1;
        }
      }
    }
    lVar1 = 0;
    do {
      lVar5 = lVar1;
      lVar1 = lVar5 + 1;
      lVar14 = lVar14 + -1;
      if (pbVar7 <= pbVar15 + lVar5) break;
    } while (pbVar15[lVar5] == 0);
    puVar9 = dest + ((uVar12 / 100 - (long)pbVar15) - lVar1) + 2;
    pcVar2 = (char *)wally_malloc((size_t)(dest + ((uVar12 / 100 + (lVar8 - (long)pbVar15)) - lVar1)
                                          ));
    *output = pcVar2;
    if (pcVar2 == (char *)0x0) {
      iVar13 = -3;
    }
    else {
      memset(pcVar2,0x31,__n_00);
      for (puVar10 = (uchar *)0x0; puVar9 != puVar10; puVar10 = puVar10 + 1) {
        (*output)[(long)(puVar10 + __n_00)] =
             "123456789ABCDEFGHJKLMNPQRSTUVWXYZabcdefghijkmnopqrstuvwxyz"
             [pbVar15[(long)(puVar10 + lVar5)]];
      }
      iVar13 = 0;
      (*output)[(long)(dest + lVar14 + (uVar12 / 100 - (long)pbVar15))] = '\0';
    }
  }
LAB_003efae9:
  wally_clear(dest,(size_t)puVar9);
  if (dest != bn_buf) {
    wally_free(dest);
  }
  return iVar13;
LAB_003ef91c:
  pcVar2 = (char *)wally_malloc(__n + 1);
  *output = pcVar2;
  if (pcVar2 != (char *)0x0) {
    memset(pcVar2,0x31,__n);
    (*output)[__n] = '\0';
    return 0;
  }
  iVar13 = -3;
  puVar9 = (uchar *)0x0;
  goto LAB_003efae9;
}

Assistant:

int wally_base58_from_bytes(const unsigned char *bytes, size_t bytes_len,
                            uint32_t flags, char **output)
{
    uint32_t checksum, *cs_p = NULL;
    unsigned char bn_buf[BIGNUM_BYTES];
    unsigned char *bn = bn_buf, *top_byte, *bn_p;
    size_t bn_bytes = 0, zeros, i, orig_len = bytes_len;
    int ret = WALLY_EINVAL;

    if (output)
        *output = NULL;

    if (!bytes || !bytes_len || (flags & ~BASE58_ALL_DEFINED_FLAGS) || !output)
        goto cleanup; /* Invalid argument */

    if (flags & BASE58_FLAG_CHECKSUM) {
        checksum = base58_get_checksum(bytes, bytes_len);
        cs_p = &checksum;
        bytes_len += 4;
    }

#define b(n) (n < orig_len ? bytes[n] : ((unsigned char *)cs_p)[n - orig_len])

    /* Process leading zeros */
    for (zeros = 0; zeros < bytes_len && !b(zeros); ++zeros)
        ; /* no-op*/

    if (zeros == bytes_len) {
        if (!(*output = wally_malloc(zeros + 1))) {
            ret = WALLY_ENOMEM;
            goto cleanup;
        }

        memset(*output, '1', zeros);
        (*output)[zeros] = '\0';
        return WALLY_OK; /* All 0's */
    }

    bn_bytes = (bytes_len - zeros) * 138 / 100 + 1; /* log(256)/log(58) rounded up */

    /* Allocate our bignum buffer if it won't fit on the stack */
    if (bn_bytes > BIGNUM_BYTES)
        if (!(bn = wally_malloc(bn_bytes))) {
            ret = WALLY_ENOMEM;
            goto cleanup;
        }

    top_byte = bn + bn_bytes - 1;
    *top_byte = 0;

    for (i = zeros; i < bytes_len; ++i) {
        uint32_t carry = b(i);
        for (bn_p = bn + bn_bytes - 1; bn_p >= top_byte; --bn_p) {
            carry = *bn_p * 256 + carry;
            *bn_p = carry % 58;
            carry = carry / 58;
            if (carry && bn_p == top_byte)
                *--top_byte = 0; /* Increase bignum size */
        }
    }

    while (!*top_byte && top_byte < bn + bn_bytes - 1)
        ++top_byte; /* Skip leading zero bytes in our bignum */

    /* Copy the result */
    bn_bytes = bn + bn_bytes - top_byte;

    if (!(*output = wally_malloc(zeros + bn_bytes + 1))) {
        ret = WALLY_ENOMEM;
        goto cleanup;
    }

    memset(*output, '1', zeros);
    for (i = 0; i < bn_bytes; ++i)
        (*output)[zeros + i] = byte_to_base58[top_byte[i]];
    (*output)[zeros + bn_bytes] = '\0';

    ret = WALLY_OK;

cleanup:
    if (bn) {
        wally_clear(bn, bn_bytes);
        if (bn != bn_buf)
            wally_free(bn);
    }
    return ret;
#undef b
}